

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QSqlDatabase __thiscall
QHash<QString,_QSqlDatabase>::value(QHash<QString,_QSqlDatabase> *this,QString *key)

{
  QSqlDatabase *other;
  QString *in_RDX;
  
  other = valueImpl<QString>((QHash<QString,_QSqlDatabase> *)key,in_RDX);
  if (other == (QSqlDatabase *)0x0) {
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)this);
  }
  else {
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)this,other);
  }
  return (QSqlDatabase)(QSqlDatabasePrivate *)this;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }